

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_extls(void)

{
  uint32_t uVar1;
  int iVar2;
  ptrdiff_t pVar3;
  char *pcVar4;
  char *d;
  ptrdiff_t sz;
  int local_2b0;
  int iStack_2ac;
  int8_t ext_type_28;
  char *local_2a8;
  char *d2_27;
  char *d1_27;
  int8_t ext_type_27;
  char *pcStack_290;
  char *d2_26;
  char *d1_26;
  int8_t ext_type_26;
  char *pcStack_278;
  char *d2_25;
  char *d1_25;
  int8_t ext_type_25;
  char *pcStack_260;
  char *d2_24;
  char *d1_24;
  int8_t ext_type_24;
  char *pcStack_248;
  char *d2_23;
  char *d1_23;
  int8_t ext_type_23;
  char *pcStack_230;
  char *d2_22;
  char *d1_22;
  int8_t ext_type_22;
  char *pcStack_218;
  char *d2_21;
  char *d1_21;
  int8_t ext_type_21;
  char *pcStack_200;
  char *d2_20;
  char *d1_20;
  int8_t ext_type_20;
  char *pcStack_1e8;
  char *d2_19;
  char *d1_19;
  int8_t ext_type_19;
  char *pcStack_1d0;
  char *d2_18;
  char *d1_18;
  int8_t ext_type_18;
  char *pcStack_1b8;
  char *d2_17;
  char *d1_17;
  int8_t ext_type_17;
  char *pcStack_1a0;
  char *d2_16;
  char *d1_16;
  int8_t ext_type_16;
  char *pcStack_188;
  char *d2_15;
  char *d1_15;
  int8_t ext_type_15;
  char *pcStack_170;
  char *d2_14;
  char *d1_14;
  int8_t ext_type_14;
  char *pcStack_158;
  char *d2_13;
  char *d1_13;
  int8_t ext_type_13;
  char *pcStack_140;
  char *d2_12;
  char *d1_12;
  int8_t ext_type_12;
  char *pcStack_128;
  char *d2_11;
  char *d1_11;
  int8_t ext_type_11;
  char *pcStack_110;
  char *d2_10;
  char *d1_10;
  int8_t ext_type_10;
  char *pcStack_f8;
  char *d2_9;
  char *d1_9;
  int8_t ext_type_9;
  char *pcStack_e0;
  char *d2_8;
  char *d1_8;
  int8_t ext_type_8;
  char *pcStack_c8;
  char *d2_7;
  char *d1_7;
  int8_t ext_type_7;
  char *pcStack_b0;
  char *d2_6;
  char *d1_6;
  int8_t ext_type_6;
  char *pcStack_98;
  char *d2_5;
  char *d1_5;
  int8_t ext_type_5;
  char *pcStack_80;
  char *d2_4;
  char *d1_4;
  int8_t ext_type_4;
  char *pcStack_68;
  char *d2_3;
  char *d1_3;
  int8_t ext_type_3;
  char *pcStack_50;
  char *d2_2;
  char *d1_2;
  int8_t ext_type_2;
  char *pcStack_38;
  char *d2_1;
  char *d1_1;
  int8_t ext_type_1;
  char *pcStack_20;
  char *d2;
  char *d1;
  int8_t ext_type;
  
  _plan(0xb1,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_extls");
  d1._7_1_ = 0;
  d2 = mp_encode_extl(data,'\0',1);
  pcStack_20 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x01U");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "mp_check_extl(0x01U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffffe0,(int8_t *)((long)&d1 + 7));
  _ok((uint)(uVar1 == 1),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x01U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "mp_decode(mp_encode(0x01U)) == 0x01U");
  _ok((uint)((long)d2 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "len(mp_encode_extl(0x01U)");
  _ok((uint)(d2 == pcStack_20),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "len(mp_decode_extl(0x01U))");
  uVar1 = mp_sizeof_extl(1);
  _ok((uint)(uVar1 == 2),"mp_sizeof_extl(0x01U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "mp_sizeof_extl(0x01U)");
  _ok((uint)(*(short *)data == 0xd4),"memcmp(data, (\"\\xd4\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f0,
      "mp_encode(0x01U) == \"\\xd4\\x00\"");
  d1_1._3_1_ = 0;
  d2_1 = mp_encode_extl(data,'\0',2);
  pcStack_38 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x02U");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "mp_check_extl(0x02U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffffc8,(int8_t *)((long)&d1_1 + 3));
  _ok((uint)(uVar1 == 2),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x02U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "mp_decode(mp_encode(0x02U)) == 0x02U");
  _ok((uint)((long)d2_1 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "len(mp_encode_extl(0x02U)");
  _ok((uint)(d2_1 == pcStack_38),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "len(mp_decode_extl(0x02U))");
  uVar1 = mp_sizeof_extl(2);
  _ok((uint)(uVar1 == 2),"mp_sizeof_extl(0x02U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "mp_sizeof_extl(0x02U)");
  _ok((uint)(*(short *)data == 0xd5),"memcmp(data, (\"\\xd5\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f1,
      "mp_encode(0x02U) == \"\\xd5\\x00\"");
  d1_2._3_1_ = 0;
  d2_2 = mp_encode_extl(data,'\0',4);
  pcStack_50 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x04U");
  d1_3._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "mp_check_extl(0x04U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffffb0,(int8_t *)((long)&d1_2 + 3));
  _ok((uint)(uVar1 == 4),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x04U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "mp_decode(mp_encode(0x04U)) == 0x04U");
  _ok((uint)((long)d2_2 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "len(mp_encode_extl(0x04U)");
  _ok((uint)(d2_2 == pcStack_50),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "len(mp_decode_extl(0x04U))");
  uVar1 = mp_sizeof_extl(4);
  _ok((uint)(uVar1 == 2),"mp_sizeof_extl(0x04U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "mp_sizeof_extl(0x04U)");
  _ok((uint)(*(short *)data == 0xd6),"memcmp(data, (\"\\xd6\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f2,
      "mp_encode(0x04U) == \"\\xd6\\x00\"");
  d1_3._3_1_ = 0;
  d2_3 = mp_encode_extl(data,'\0',8);
  pcStack_68 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x08U");
  d1_4._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_3);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "mp_check_extl(0x08U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff98,(int8_t *)((long)&d1_3 + 3));
  _ok((uint)(uVar1 == 8),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x08U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "mp_decode(mp_encode(0x08U)) == 0x08U");
  _ok((uint)((long)d2_3 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "len(mp_encode_extl(0x08U)");
  _ok((uint)(d2_3 == pcStack_68),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "len(mp_decode_extl(0x08U))");
  uVar1 = mp_sizeof_extl(8);
  _ok((uint)(uVar1 == 2),"mp_sizeof_extl(0x08U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "mp_sizeof_extl(0x08U)");
  _ok((uint)(*(short *)data == 0xd7),"memcmp(data, (\"\\xd7\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
      "mp_encode(0x08U) == \"\\xd7\\x00\"");
  d1_4._3_1_ = 0;
  d2_4 = mp_encode_extl(data,'\0',0x10);
  pcStack_80 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x10U");
  d1_5._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_4);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "mp_check_extl(0x10U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff80,(int8_t *)((long)&d1_4 + 3));
  _ok((uint)(uVar1 == 0x10),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x10U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "mp_decode(mp_encode(0x10U)) == 0x10U");
  _ok((uint)((long)d2_4 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "len(mp_encode_extl(0x10U)");
  _ok((uint)(d2_4 == pcStack_80),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "len(mp_decode_extl(0x10U))");
  uVar1 = mp_sizeof_extl(0x10);
  _ok((uint)(uVar1 == 2),"mp_sizeof_extl(0x10U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "mp_sizeof_extl(0x10U)");
  _ok((uint)(*(short *)data == 0xd8),"memcmp(data, (\"\\xd8\\x00\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
      "mp_encode(0x10U) == \"\\xd8\\x00\"");
  d1_5._3_1_ = 0;
  d2_5 = mp_encode_extl(data,'\0',0x11);
  pcStack_98 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x11U");
  d1_6._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_5);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "mp_check_extl(0x11U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff68,(int8_t *)((long)&d1_5 + 3));
  _ok((uint)(uVar1 == 0x11),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x11U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "mp_decode(mp_encode(0x11U)) == 0x11U");
  _ok((uint)((long)d2_5 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "len(mp_encode_extl(0x11U)");
  _ok((uint)(d2_5 == pcStack_98),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "len(mp_decode_extl(0x11U))");
  uVar1 = mp_sizeof_extl(0x11);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x11U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "mp_sizeof_extl(0x11U)");
  iVar2 = memcmp(data,anon_var_dwarf_431b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x11\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f7,
      "mp_encode(0x11U) == \"\\xc7\\x11\\x00\"");
  d1_6._3_1_ = 0;
  d2_6 = mp_encode_extl(data,'\0',0xfe);
  pcStack_b0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xfeU");
  d1_7._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_6);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "mp_check_extl(0xfeU) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff50,(int8_t *)((long)&d1_6 + 3));
  _ok((uint)(uVar1 == 0xfe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "mp_decode(mp_encode(0xfeU)) == 0xfeU");
  _ok((uint)((long)d2_6 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "len(mp_encode_extl(0xfeU)");
  _ok((uint)(d2_6 == pcStack_b0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "len(mp_decode_extl(0xfeU))");
  uVar1 = mp_sizeof_extl(0xfe);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0xfeU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "mp_sizeof_extl(0xfeU)");
  iVar2 = memcmp(data,anon_var_dwarf_4393,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\xfe\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f8,
      "mp_encode(0xfeU) == \"\\xc7\\xfe\\x00\"");
  d1_7._3_1_ = 0;
  d2_7 = mp_encode_extl(data,'\0',0xff);
  pcStack_c8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xffU");
  d1_8._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_7);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "mp_check_extl(0xffU) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff38,(int8_t *)((long)&d1_7 + 3));
  _ok((uint)(uVar1 == 0xff),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "mp_decode(mp_encode(0xffU)) == 0xffU");
  _ok((uint)((long)d2_7 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "len(mp_encode_extl(0xffU)");
  _ok((uint)(d2_7 == pcStack_c8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "len(mp_decode_extl(0xffU))");
  uVar1 = mp_sizeof_extl(0xff);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0xffU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "mp_sizeof_extl(0xffU)");
  iVar2 = memcmp(data,anon_var_dwarf_440b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\xff\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1f9,
      "mp_encode(0xffU) == \"\\xc7\\xff\\x00\"");
  d1_8._3_1_ = 0;
  d2_8 = mp_encode_extl(data,'\0',0);
  pcStack_e0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x00U");
  d1_9._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_8);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "mp_check_extl(0x00U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff20,(int8_t *)((long)&d1_8 + 3));
  _ok((uint)(uVar1 == 0),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "mp_decode(mp_encode(0x00U)) == 0x00U");
  _ok((uint)((long)d2_8 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "len(mp_encode_extl(0x00U)");
  _ok((uint)(d2_8 == pcStack_e0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "len(mp_decode_extl(0x00U))");
  uVar1 = mp_sizeof_extl(0);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x00U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "mp_sizeof_extl(0x00U)");
  iVar2 = memcmp(data,anon_var_dwarf_4483,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x00\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fb,
      "mp_encode(0x00U) == \"\\xc7\\x00\\x00\"");
  d1_9._3_1_ = 0;
  d2_9 = mp_encode_extl(data,'\0',3);
  pcStack_f8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x03U");
  d1_10._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_9);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "mp_check_extl(0x03U) == 0");
  uVar1 = mp_decode_extl(&stack0xffffffffffffff08,(int8_t *)((long)&d1_9 + 3));
  _ok((uint)(uVar1 == 3),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x03U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "mp_decode(mp_encode(0x03U)) == 0x03U");
  _ok((uint)((long)d2_9 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "len(mp_encode_extl(0x03U)");
  _ok((uint)(d2_9 == pcStack_f8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "len(mp_decode_extl(0x03U))");
  uVar1 = mp_sizeof_extl(3);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x03U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "mp_sizeof_extl(0x03U)");
  iVar2 = memcmp(data,anon_var_dwarf_4507,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x03\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fc,
      "mp_encode(0x03U) == \"\\xc7\\x03\\x00\"");
  d1_10._3_1_ = 0;
  d2_10 = mp_encode_extl(data,'\0',5);
  pcStack_110 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x05U");
  d1_11._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_10);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "mp_check_extl(0x05U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffef0,(int8_t *)((long)&d1_10 + 3));
  _ok((uint)(uVar1 == 5),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x05U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "mp_decode(mp_encode(0x05U)) == 0x05U");
  _ok((uint)((long)d2_10 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "len(mp_encode_extl(0x05U)");
  _ok((uint)(d2_10 == pcStack_110),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "len(mp_decode_extl(0x05U))");
  uVar1 = mp_sizeof_extl(5);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x05U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "mp_sizeof_extl(0x05U)");
  iVar2 = memcmp(data,anon_var_dwarf_458b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x05\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fd,
      "mp_encode(0x05U) == \"\\xc7\\x05\\x00\"");
  d1_11._3_1_ = 0;
  d2_11 = mp_encode_extl(data,'\0',6);
  pcStack_128 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x06U");
  d1_12._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_11);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "mp_check_extl(0x06U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffed8,(int8_t *)((long)&d1_11 + 3));
  _ok((uint)(uVar1 == 6),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x06U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "mp_decode(mp_encode(0x06U)) == 0x06U");
  _ok((uint)((long)d2_11 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "len(mp_encode_extl(0x06U)");
  _ok((uint)(d2_11 == pcStack_128),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "len(mp_decode_extl(0x06U))");
  uVar1 = mp_sizeof_extl(6);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x06U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "mp_sizeof_extl(0x06U)");
  iVar2 = memcmp(data,anon_var_dwarf_460f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x06\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1fe,
      "mp_encode(0x06U) == \"\\xc7\\x06\\x00\"");
  d1_12._3_1_ = 0;
  d2_12 = mp_encode_extl(data,'\0',7);
  pcStack_140 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x07U");
  d1_13._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_12);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "mp_check_extl(0x07U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffec0,(int8_t *)((long)&d1_12 + 3));
  _ok((uint)(uVar1 == 7),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x07U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "mp_decode(mp_encode(0x07U)) == 0x07U");
  _ok((uint)((long)d2_12 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "len(mp_encode_extl(0x07U)");
  _ok((uint)(d2_12 == pcStack_140),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "len(mp_decode_extl(0x07U))");
  uVar1 = mp_sizeof_extl(7);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x07U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "mp_sizeof_extl(0x07U)");
  iVar2 = memcmp(data,anon_var_dwarf_4693,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x07\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ff,
      "mp_encode(0x07U) == \"\\xc7\\x07\\x00\"");
  d1_13._3_1_ = 0;
  d2_13 = mp_encode_extl(data,'\0',9);
  pcStack_158 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x09U");
  d1_14._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_13);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "mp_check_extl(0x09U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffea8,(int8_t *)((long)&d1_13 + 3));
  _ok((uint)(uVar1 == 9),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x09U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "mp_decode(mp_encode(0x09U)) == 0x09U");
  _ok((uint)((long)d2_13 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "len(mp_encode_extl(0x09U)");
  _ok((uint)(d2_13 == pcStack_158),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "len(mp_decode_extl(0x09U))");
  uVar1 = mp_sizeof_extl(9);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x09U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "mp_sizeof_extl(0x09U)");
  iVar2 = memcmp(data,anon_var_dwarf_4717,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x09\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x200,
      "mp_encode(0x09U) == \"\\xc7\\x09\\x00\"");
  d1_14._3_1_ = 0;
  d2_14 = mp_encode_extl(data,'\0',10);
  pcStack_170 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0aU");
  d1_15._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_14);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "mp_check_extl(0x0aU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe90,(int8_t *)((long)&d1_14 + 3));
  _ok((uint)(uVar1 == 10),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0aU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "mp_decode(mp_encode(0x0aU)) == 0x0aU");
  _ok((uint)((long)d2_14 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "len(mp_encode_extl(0x0aU)");
  _ok((uint)(d2_14 == pcStack_170),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "len(mp_decode_extl(0x0aU))");
  uVar1 = mp_sizeof_extl(10);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0aU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "mp_sizeof_extl(0x0aU)");
  iVar2 = memcmp(data,anon_var_dwarf_479b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x201,
      "mp_encode(0x0aU) == \"\\xc7\\x0a\\x00\"");
  d1_15._3_1_ = 0;
  d2_15 = mp_encode_extl(data,'\0',0xb);
  pcStack_188 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0bU");
  d1_16._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_15);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "mp_check_extl(0x0bU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe78,(int8_t *)((long)&d1_15 + 3));
  _ok((uint)(uVar1 == 0xb),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0bU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "mp_decode(mp_encode(0x0bU)) == 0x0bU");
  _ok((uint)((long)d2_15 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "len(mp_encode_extl(0x0bU)");
  _ok((uint)(d2_15 == pcStack_188),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "len(mp_decode_extl(0x0bU))");
  uVar1 = mp_sizeof_extl(0xb);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0bU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "mp_sizeof_extl(0x0bU)");
  iVar2 = memcmp(data,anon_var_dwarf_481f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0b\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x202,
      "mp_encode(0x0bU) == \"\\xc7\\x0b\\x00\"");
  d1_16._3_1_ = 0;
  d2_16 = mp_encode_extl(data,'\0',0xc);
  pcStack_1a0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0cU");
  d1_17._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_16);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "mp_check_extl(0x0cU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe60,(int8_t *)((long)&d1_16 + 3));
  _ok((uint)(uVar1 == 0xc),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0cU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "mp_decode(mp_encode(0x0cU)) == 0x0cU");
  _ok((uint)((long)d2_16 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "len(mp_encode_extl(0x0cU)");
  _ok((uint)(d2_16 == pcStack_1a0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "len(mp_decode_extl(0x0cU))");
  uVar1 = mp_sizeof_extl(0xc);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0cU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "mp_sizeof_extl(0x0cU)");
  iVar2 = memcmp(data,anon_var_dwarf_48a3,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0c\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x203,
      "mp_encode(0x0cU) == \"\\xc7\\x0c\\x00\"");
  d1_17._3_1_ = 0;
  d2_17 = mp_encode_extl(data,'\0',0xd);
  pcStack_1b8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0dU");
  d1_18._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_17);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "mp_check_extl(0x0dU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe48,(int8_t *)((long)&d1_17 + 3));
  _ok((uint)(uVar1 == 0xd),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0dU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "mp_decode(mp_encode(0x0dU)) == 0x0dU");
  _ok((uint)((long)d2_17 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "len(mp_encode_extl(0x0dU)");
  _ok((uint)(d2_17 == pcStack_1b8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "len(mp_decode_extl(0x0dU))");
  uVar1 = mp_sizeof_extl(0xd);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0dU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "mp_sizeof_extl(0x0dU)");
  iVar2 = memcmp(data,anon_var_dwarf_4927,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0d\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x204,
      "mp_encode(0x0dU) == \"\\xc7\\x0d\\x00\"");
  d1_18._3_1_ = 0;
  d2_18 = mp_encode_extl(data,'\0',0xe);
  pcStack_1d0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0eU");
  d1_19._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_18);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "mp_check_extl(0x0eU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe30,(int8_t *)((long)&d1_18 + 3));
  _ok((uint)(uVar1 == 0xe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0eU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "mp_decode(mp_encode(0x0eU)) == 0x0eU");
  _ok((uint)((long)d2_18 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "len(mp_encode_extl(0x0eU)");
  _ok((uint)(d2_18 == pcStack_1d0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "len(mp_decode_extl(0x0eU))");
  uVar1 = mp_sizeof_extl(0xe);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0eU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "mp_sizeof_extl(0x0eU)");
  iVar2 = memcmp(data,anon_var_dwarf_49ab,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0e\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x205,
      "mp_encode(0x0eU) == \"\\xc7\\x0e\\x00\"");
  d1_19._3_1_ = 0;
  d2_19 = mp_encode_extl(data,'\0',0xf);
  pcStack_1e8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0fU");
  d1_20._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_19);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "mp_check_extl(0x0fU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe18,(int8_t *)((long)&d1_19 + 3));
  _ok((uint)(uVar1 == 0xf),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0fU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "mp_decode(mp_encode(0x0fU)) == 0x0fU");
  _ok((uint)((long)d2_19 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "len(mp_encode_extl(0x0fU)");
  _ok((uint)(d2_19 == pcStack_1e8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "len(mp_decode_extl(0x0fU))");
  uVar1 = mp_sizeof_extl(0xf);
  _ok((uint)(uVar1 == 3),"mp_sizeof_extl(0x0fU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "mp_sizeof_extl(0x0fU)");
  iVar2 = memcmp(data,anon_var_dwarf_4a2f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0f\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x206,
      "mp_encode(0x0fU) == \"\\xc7\\x0f\\x00\"");
  d1_20._3_1_ = 0;
  d2_20 = mp_encode_extl(data,'\0',0x100);
  pcStack_200 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0100U");
  d1_21._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_20);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "mp_check_extl(0x0100U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffe00,(int8_t *)((long)&d1_20 + 3));
  _ok((uint)(uVar1 == 0x100),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0100U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "mp_decode(mp_encode(0x0100U)) == 0x0100U");
  _ok((uint)((long)d2_20 - (long)data == 4),"(d1 - data) == (4)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "len(mp_encode_extl(0x0100U)");
  _ok((uint)(d2_20 == pcStack_200),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "len(mp_decode_extl(0x0100U))");
  uVar1 = mp_sizeof_extl(0x100);
  _ok((uint)(uVar1 == 4),"mp_sizeof_extl(0x0100U) == 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "mp_sizeof_extl(0x0100U)");
  _ok((uint)(*(int *)data == 0x1c8),"memcmp(data, (\"\\xc8\\x01\\x00\\x00\"), (4)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x209,
      "mp_encode(0x0100U) == \"\\xc8\\x01\\x00\\x00\"");
  d1_21._3_1_ = 0;
  d2_21 = mp_encode_extl(data,'\0',0x101);
  pcStack_218 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x0101U");
  d1_22._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_21);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "mp_check_extl(0x0101U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffde8,(int8_t *)((long)&d1_21 + 3));
  _ok((uint)(uVar1 == 0x101),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0101U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "mp_decode(mp_encode(0x0101U)) == 0x0101U");
  _ok((uint)((long)d2_21 - (long)data == 4),"(d1 - data) == (4)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "len(mp_encode_extl(0x0101U)");
  _ok((uint)(d2_21 == pcStack_218),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "len(mp_decode_extl(0x0101U))");
  uVar1 = mp_sizeof_extl(0x101);
  _ok((uint)(uVar1 == 4),"mp_sizeof_extl(0x0101U) == 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "mp_sizeof_extl(0x0101U)");
  _ok((uint)(*(int *)data == 0x101c8),"memcmp(data, (\"\\xc8\\x01\\x01\\x00\"), (4)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20a,
      "mp_encode(0x0101U) == \"\\xc8\\x01\\x01\\x00\"");
  d1_22._3_1_ = 0;
  d2_22 = mp_encode_extl(data,'\0',0xfffe);
  pcStack_230 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xfffeU");
  d1_23._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_22);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "mp_check_extl(0xfffeU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffdd0,(int8_t *)((long)&d1_22 + 3));
  _ok((uint)(uVar1 == 0xfffe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "mp_decode(mp_encode(0xfffeU)) == 0xfffeU");
  _ok((uint)((long)d2_22 - (long)data == 4),"(d1 - data) == (4)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "len(mp_encode_extl(0xfffeU)");
  _ok((uint)(d2_22 == pcStack_230),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "len(mp_decode_extl(0xfffeU))");
  uVar1 = mp_sizeof_extl(0xfffe);
  _ok((uint)(uVar1 == 4),"mp_sizeof_extl(0xfffeU) == 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "mp_sizeof_extl(0xfffeU)");
  _ok((uint)(*(int *)data == 0xfeffc8),"memcmp(data, (\"\\xc8\\xff\\xfe\\x00\"), (4)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20b,
      "mp_encode(0xfffeU) == \"\\xc8\\xff\\xfe\\x00\"");
  d1_23._3_1_ = 0;
  d2_23 = mp_encode_extl(data,'\0',0xffff);
  pcStack_248 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xffffU");
  d1_24._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_23);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "mp_check_extl(0xffffU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffdb8,(int8_t *)((long)&d1_23 + 3));
  _ok((uint)(uVar1 == 0xffff),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "mp_decode(mp_encode(0xffffU)) == 0xffffU");
  _ok((uint)((long)d2_23 - (long)data == 4),"(d1 - data) == (4)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "len(mp_encode_extl(0xffffU)");
  _ok((uint)(d2_23 == pcStack_248),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "len(mp_decode_extl(0xffffU))");
  uVar1 = mp_sizeof_extl(0xffff);
  _ok((uint)(uVar1 == 4),"mp_sizeof_extl(0xffffU) == 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "mp_sizeof_extl(0xffffU)");
  _ok((uint)(*(int *)data == 0xffffc8),"memcmp(data, (\"\\xc8\\xff\\xff\\x00\"), (4)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20c,
      "mp_encode(0xffffU) == \"\\xc8\\xff\\xff\\x00\"");
  d1_24._3_1_ = 0;
  d2_24 = mp_encode_extl(data,'\0',0x10000);
  pcStack_260 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x00010000U");
  d1_25._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_24);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "mp_check_extl(0x00010000U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffda0,(int8_t *)((long)&d1_24 + 3));
  _ok((uint)(uVar1 == 0x10000),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00010000U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "mp_decode(mp_encode(0x00010000U)) == 0x00010000U");
  _ok((uint)((long)d2_24 - (long)data == 6),"(d1 - data) == (6)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "len(mp_encode_extl(0x00010000U)");
  _ok((uint)(d2_24 == pcStack_260),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "len(mp_decode_extl(0x00010000U))");
  uVar1 = mp_sizeof_extl(0x10000);
  _ok((uint)(uVar1 == 6),"mp_sizeof_extl(0x00010000U) == 6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "mp_sizeof_extl(0x00010000U)");
  iVar2 = memcmp(data,anon_var_dwarf_4cab,6);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc9\\x00\\x01\\x00\\x00\\x00\"), (6)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x20f,
      "mp_encode(0x00010000U) == \"\\xc9\\x00\\x01\\x00\\x00\\x00\"");
  d1_25._3_1_ = 0;
  d2_25 = mp_encode_extl(data,'\0',0x10001);
  pcStack_278 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0x00010001U");
  d1_26._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_25);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "mp_check_extl(0x00010001U) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffd88,(int8_t *)((long)&d1_25 + 3));
  _ok((uint)(uVar1 == 0x10001),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00010001U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "mp_decode(mp_encode(0x00010001U)) == 0x00010001U");
  _ok((uint)((long)d2_25 - (long)data == 6),"(d1 - data) == (6)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "len(mp_encode_extl(0x00010001U)");
  _ok((uint)(d2_25 == pcStack_278),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "len(mp_decode_extl(0x00010001U))");
  uVar1 = mp_sizeof_extl(0x10001);
  _ok((uint)(uVar1 == 6),"mp_sizeof_extl(0x00010001U) == 6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "mp_sizeof_extl(0x00010001U)");
  iVar2 = memcmp(data,anon_var_dwarf_4d2f,6);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc9\\x00\\x01\\x00\\x01\\x00\"), (6)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x210,
      "mp_encode(0x00010001U) == \"\\xc9\\x00\\x01\\x00\\x01\\x00\"");
  d1_26._3_1_ = 0;
  d2_26 = mp_encode_extl(data,'\0',0xfffffffe);
  pcStack_290 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xfffffffeU");
  d1_27._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_26);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "mp_check_extl(0xfffffffeU) == 0");
  uVar1 = mp_decode_extl(&stack0xfffffffffffffd70,(int8_t *)((long)&d1_26 + 3));
  _ok((uint)(uVar1 == 0xfffffffe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfffffffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
  _ok((uint)((long)d2_26 - (long)data == 6),"(d1 - data) == (6)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "len(mp_encode_extl(0xfffffffeU)");
  _ok((uint)(d2_26 == pcStack_290),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "len(mp_decode_extl(0xfffffffeU))");
  uVar1 = mp_sizeof_extl(0xfffffffe);
  _ok((uint)(uVar1 == 6),"mp_sizeof_extl(0xfffffffeU) == 6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "mp_sizeof_extl(0xfffffffeU)");
  iVar2 = memcmp(data,anon_var_dwarf_4da7,6);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc9\\xff\\xff\\xff\\xfe\\x00\"), (6)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x211,
      "mp_encode(0xfffffffeU) == \"\\xc9\\xff\\xff\\xff\\xfe\\x00\"");
  d1_27._3_1_ = 0;
  d2_27 = mp_encode_extl(data,'\0',0xffffffff);
  local_2a8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl 0xffffffffU");
  iStack_2ac = fprintf(_stdout,"\n");
  pVar3 = mp_check_extl(data,d2_27);
  _ok((uint)(pVar3 == 0),"mp_check_extl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "mp_check_extl(0xffffffffU) == 0");
  uVar1 = mp_decode_extl(&local_2a8,(int8_t *)((long)&d1_27 + 3));
  _ok((uint)(uVar1 == 0xffffffff),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffffffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
  _ok((uint)((long)d2_27 - (long)data == 6),"(d1 - data) == (6)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "len(mp_encode_extl(0xffffffffU)");
  _ok((uint)(d2_27 == local_2a8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "len(mp_decode_extl(0xffffffffU))");
  uVar1 = mp_sizeof_extl(0xffffffff);
  _ok((uint)(uVar1 == 6),"mp_sizeof_extl(0xffffffffU) == 6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "mp_sizeof_extl(0xffffffffU)");
  iVar2 = memcmp(data,anon_var_dwarf_4e1f,6);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc9\\xff\\xff\\xff\\xff\\x00\"), (6)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x212,
      "mp_encode(0xffffffffU) == \"\\xc9\\xff\\xff\\xff\\xff\\x00\"");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"extl_safe");
  local_2b0 = fprintf(_stdout,"\n");
  sz._7_1_ = '\0';
  d = (char *)0x0;
  pcVar4 = mp_encode_extl_safe((char *)0x0,(ptrdiff_t *)&d,'\0',10);
  _ok((uint)(d == (char *)0xfffffffffffffffd),"-sz == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "size after mp_encode_extl_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "mp_encode_extl_safe(NULL, &sz)");
  d = (char *)0x3;
  pcVar4 = mp_encode_extl_safe(data,(ptrdiff_t *)&d,sz._7_1_,10);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "size after mp_encode_extl_safe(buf, &sz)");
  _ok((uint)((long)pcVar4 - (long)data == 3),"(d - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "len of mp_encode_extl_safe(buf, &sz)");
  iVar2 = memcmp(data,anon_var_dwarf_479b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "mp_encode_extl_safe(buf, &sz)");
  d = (char *)0x2;
  pcVar4 = mp_encode_extl_safe(data,(ptrdiff_t *)&d,sz._7_1_,10);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "size after mp_encode_extl_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "mp_encode_extl_safe(buf, &sz) overflow");
  pcVar4 = mp_encode_extl_safe(data,(ptrdiff_t *)0x0,sz._7_1_,10);
  _ok((uint)((long)pcVar4 - (long)data == 3),"(d - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "len of mp_encode_extl_safe(buf, NULL)");
  iVar2 = memcmp(data,anon_var_dwarf_479b,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x214,
      "mp_encode_extl_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_extls");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

static int
test_extls(void)
{
	plan(28*6 + 9);
	header();

	/* fixext 1,2,4,8,16 */
	test_extl(0x01U, "\xd4\x00", 2);
	test_extl(0x02U, "\xd5\x00", 2);
	test_extl(0x04U, "\xd6\x00", 2);
	test_extl(0x08U, "\xd7\x00", 2);
	test_extl(0x10U, "\xd8\x00", 2);

	/* ext 8 */
	test_extl(0x11U, "\xc7\x11\x00", 3);
	test_extl(0xfeU, "\xc7\xfe\x00", 3);
	test_extl(0xffU, "\xc7\xff\x00", 3);

	test_extl(0x00U, "\xc7\x00\x00", 3);
	test_extl(0x03U, "\xc7\x03\x00", 3);
	test_extl(0x05U, "\xc7\x05\x00", 3);
	test_extl(0x06U, "\xc7\x06\x00", 3);
	test_extl(0x07U, "\xc7\x07\x00", 3);
	test_extl(0x09U, "\xc7\x09\x00", 3);
	test_extl(0x0aU, "\xc7\x0a\x00", 3);
	test_extl(0x0bU, "\xc7\x0b\x00", 3);
	test_extl(0x0cU, "\xc7\x0c\x00", 3);
	test_extl(0x0dU, "\xc7\x0d\x00", 3);
	test_extl(0x0eU, "\xc7\x0e\x00", 3);
	test_extl(0x0fU, "\xc7\x0f\x00", 3);

	/* ext 16 */
	test_extl(0x0100U, "\xc8\x01\x00\x00", 4);
	test_extl(0x0101U, "\xc8\x01\x01\x00", 4);
	test_extl(0xfffeU, "\xc8\xff\xfe\x00", 4);
	test_extl(0xffffU, "\xc8\xff\xff\x00", 4);

	/* ext 32 */
	test_extl(0x00010000U, "\xc9\x00\x01\x00\x00\x00", 6);
	test_extl(0x00010001U, "\xc9\x00\x01\x00\x01\x00", 6);
	test_extl(0xfffffffeU, "\xc9\xff\xff\xff\xfe\x00", 6);
	test_extl(0xffffffffU, "\xc9\xff\xff\xff\xff\x00", 6);

	test_extl_safe(0x0aU, "\xc7\x0a\x00", 3);

	footer();
	return check_plan();
}